

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

int sprkStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  N_Vector p_Var4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  N_Vector p_Var9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  plVar3 = (long *)ark_mem->step_mem;
  iVar8 = 0;
  if (plVar3 == (long *)0x0) {
    iVar8 = -0x15;
    arkProcessError(ark_mem,-0x15,0x2e8,"sprkStep_TakeStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    lVar7 = *plVar3;
    if (0 < *(int *)(lVar7 + 4)) {
      p_Var4 = ark_mem->ycur;
      p_Var9 = ark_mem->yn;
      dVar11 = 0.0;
      lVar10 = 0;
      dVar12 = 0.0;
      do {
        dVar1 = *(double *)(*(long *)(lVar7 + 8) + lVar10 * 8);
        dVar2 = *(double *)(*(long *)(lVar7 + 0x10) + lVar10 * 8);
        dVar12 = dVar12 + dVar1;
        dVar11 = dVar11 + dVar2;
        *(int *)(plVar3 + 8) = (int)lVar10;
        N_VConst(0,plVar3[2]);
        iVar6 = (*(code *)plVar3[4])
                          (ark_mem->h * dVar11 + ark_mem->tn,p_Var9,plVar3[2],ark_mem->user_data);
        plVar3[6] = plVar3[6] + 1;
        if (iVar6 == 0) {
          N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var9,plVar3[2],p_Var4);
          ark_mem->tcur = ark_mem->h * dVar11 + ark_mem->tn;
          N_VConst(0,plVar3[2]);
          iVar6 = (*(code *)plVar3[5])
                            (ark_mem->h * dVar12 + ark_mem->tn,p_Var4,plVar3[2],ark_mem->user_data);
          plVar3[7] = plVar3[7] + 1;
          if (iVar6 != 0) goto LAB_0014b7b9;
          N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
          if ((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
             (iVar6 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
             iVar6 == 0)) {
            *(int *)(plVar3 + 8) = (int)plVar3[8] + 1;
            bVar5 = true;
            p_Var9 = p_Var4;
          }
          else {
            iVar8 = -0x26;
            bVar5 = false;
          }
        }
        else {
LAB_0014b7b9:
          bVar5 = false;
          iVar8 = -8;
        }
        if (!bVar5) {
          return iVar8;
        }
        lVar10 = lVar10 + 1;
        lVar7 = *plVar3;
      } while (lVar10 < *(int *)(lVar7 + 4));
    }
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int sprkStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector prev_stage        = NULL;
  N_Vector curr_stage        = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  prev_stage = ark_mem->yn;
  curr_stage = ark_mem->ycur;
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    /* evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h, prev_stage,
                         step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return ARK_RHSFUNC_FAIL; }

    /* position update */
    N_VLinearSum(ONE, prev_stage, ark_mem->h * ahati, step_mem->sdata,
                 curr_stage);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h, curr_stage,
                         step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return ARK_RHSFUNC_FAIL; }

    /* velocity update */
    N_VLinearSum(ONE, curr_stage, ark_mem->h * ai, step_mem->sdata, curr_stage);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) { return (ARK_POSTPROCESS_STAGE_FAIL); }
    }

    /* keep track of the stage number */
    step_mem->istage++;

    prev_stage = curr_stage;
  }

  *nflagPtr = 0;
  *dsmPtr   = 0;

  return ARK_SUCCESS;
}